

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O2

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::PlainGatherFloat2DSrgbAlpha>(void)

{
  GatherBase *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (GatherBase *)operator_new(0x60);
  (this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl =
       (Functions *)0x0;
  (this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0
  ;
  *(undefined8 *)
   &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  (this->super_TGBase).super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0;
  (this->super_TGBase).renderTarget = (RenderTarget *)0x0;
  (this->super_TGBase).pixelFormat = (PixelFormat *)0x0;
  (this->super_TGBase).g_color_eps.m_data[0] = 0.0;
  (this->super_TGBase).g_color_eps.m_data[1] = 0.0;
  (this->super_TGBase).g_color_eps.m_data[2] = 0.0;
  (this->super_TGBase).g_color_eps.m_data[3] = 0.0;
  this->tex = 0;
  this->fbo = 0;
  this->rbo = 0;
  this->program = 0;
  this->vao = 0;
  this->vbo = 0;
  gl4cts::anon_unknown_0::GatherBase::GatherBase(this);
  (this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01dc00e8;
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}